

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

void __thiscall
SGParser::Generator::NFA::CombineNFAs
          (NFA *this,
          vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *NFAList)

{
  pointer ppNVar1;
  NFA *pNVar2;
  pointer ppNVar3;
  NFANode *modify;
  NFA *this_00;
  pointer ppNVar4;
  
  this_00 = this;
  modify = NewState(this,0);
  if (this->pStartState != (NFANode *)0x0) {
    AddLink(this_00,modify,0,this->pStartState);
  }
  this->pStartState = modify;
  ppNVar1 = (NFAList->
            super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar4 = (NFAList->
                 super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar1;
      ppNVar4 = ppNVar4 + 1) {
    pNVar2 = *ppNVar4;
    AddLink(this_00,this->pStartState,0,pNVar2->pStartState);
    this_00 = (NFA *)&this->FinalState;
    std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
    insert<__gnu_cxx::__normal_iterator<SGParser::Generator::NFANode**,std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>>,void>
              ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                *)&this->FinalState,
               (const_iterator)
               (this->FinalState).
               super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                )(pNVar2->FinalState).
                 super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                )(pNVar2->FinalState).
                 super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    pNVar2->pStartState = (NFANode *)0x0;
    ppNVar3 = (pNVar2->FinalState).
              super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pNVar2->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppNVar3) {
      (pNVar2->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
    }
  }
  return;
}

Assistant:

void NFA::CombineNFAs(const std::vector<NFA*>& NFAList) {
    // Create a new start state
    const auto pnewStartState = NewState(0u);

    // If this NFA is valid than treat it as though it was one of the others
    if (pStartState)
        AddLink(pnewStartState, NFANode::Epsilon, pStartState);

    pStartState = pnewStartState;

    // Connect the start state to the start state of each of the NFAs in the list
    // Also add each NFAs final states to our final state list
    for (const auto nfa : NFAList) {
        // Should probably check to see if any of the NFA's are equal to this one

        AddLink(pStartState, NFANode::Epsilon, nfa->pStartState);
        FinalState.insert(FinalState.end(), nfa->FinalState.begin(), nfa->FinalState.end());

        // Clear the NFA
        nfa->pStartState = nullptr;
        nfa->FinalState.clear();
    }
}